

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TypeSpecializeLdLen
          (GlobOpt *this,Instr **instrRef,Value **src1ValueRef,Value **dstValueRef,
          bool *forceInvariantHoistingRef)

{
  Instr *pIVar1;
  Value *src1Value_00;
  code *pcVar2;
  bool bVar3;
  IRType type;
  ValueType baseValueType;
  int32 iVar4;
  int32 newMax;
  BailOutKind BVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  RegOpnd *pRVar8;
  ArrayRegOpnd *this_00;
  StackSym *this_01;
  GlobOptBlockData *this_02;
  Value *pVVar9;
  StackSym *pSVar10;
  IntConstantBounds local_90;
  IntConstantBounds lengthConstantBounds;
  ValueInfo *lengthValueInfo;
  Value *lengthValue;
  StackSym *lengthSym;
  RegOpnd *baseOpnd;
  BailOutKind bailOutKind;
  bool *forceInvariantHoisting;
  Value **dstValue;
  Value **src1Value;
  Instr **instr;
  bool *forceInvariantHoistingRef_local;
  Value **dstValueRef_local;
  Value **src1ValueRef_local;
  Instr **instrRef_local;
  GlobOpt *this_local;
  
  if (instrRef == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b3,"(instrRef)","instrRef");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (*instrRef == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b5,"(instr)","instr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((*instrRef)->m_opcode != LdLen_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b6,"(instr->m_opcode == Js::OpCode::LdLen_A)",
                       "instr->m_opcode == Js::OpCode::LdLen_A");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (src1ValueRef == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b7,"(src1ValueRef)","src1ValueRef");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (dstValueRef == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b9,"(dstValueRef)","dstValueRef");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (forceInvariantHoistingRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29bb,"(forceInvariantHoistingRef)","forceInvariantHoistingRef");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pIVar1 = *instrRef;
  pOVar7 = IR::Instr::GetSrc1(*instrRef);
  baseValueType = IR::Opnd::GetValueType(pOVar7);
  bVar3 = DoLdLenIntSpec(this,pIVar1,baseValueType);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    baseOpnd._0_4_ = BailOutOnIrregularLength;
    bVar3 = IsLoopPrePass(this);
    if (!bVar3) {
      pOVar7 = IR::Instr::GetSrc1(*instrRef);
      pRVar8 = IR::Opnd::AsRegOpnd(pOVar7);
      bVar3 = IR::RegOpnd::IsArrayRegOpnd(pRVar8);
      if (bVar3) {
        this_00 = IR::RegOpnd::AsArrayRegOpnd(pRVar8);
        this_01 = IR::ArrayRegOpnd::LengthSym(this_00);
        if (this_01 != (StackSym *)0x0) {
          CaptureByteCodeSymUses(this,*instrRef);
          (*instrRef)->m_opcode = Ld_I4;
          pIVar1 = *instrRef;
          type = StackSym::GetType(this_01);
          pRVar8 = IR::RegOpnd::New(this_01,type,this->func);
          IR::Instr::ReplaceSrc1(pIVar1,&pRVar8->super_Opnd);
          IR::Instr::ClearBailOutInfo(*instrRef);
          this_02 = CurrentBlockData(this);
          pVVar9 = GlobOptBlockData::FindValue(this_02,&this_01->super_Sym);
          if (pVVar9 == (Value *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x29d3,"(lengthValue)","lengthValue");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          *src1ValueRef = pVVar9;
          lengthConstantBounds = (IntConstantBounds)::Value::GetValueInfo(pVVar9);
          IntConstantBounds::IntConstantBounds(&local_90);
          bVar3 = ValueInfo::TryGetIntConstantBounds
                            ((ValueInfo *)lengthConstantBounds,&local_90,false);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x29d7,
                               "(lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds))",
                               "lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds)");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          iVar4 = IntConstantBounds::LowerBound(&local_90);
          if (iVar4 < 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x29d8,"(lengthConstantBounds.LowerBound() >= 0)",
                               "lengthConstantBounds.LowerBound() >= 0");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          pSVar10 = (StackSym *)ValueInfo::GetSymStore((ValueInfo *)lengthConstantBounds);
          if (pSVar10 == this_01) {
            ValueInfo::SetSymStore((ValueInfo *)lengthConstantBounds,(Sym *)0x0);
          }
          pIVar1 = *instrRef;
          pVVar9 = *src1ValueRef;
          src1Value_00 = *src1ValueRef;
          iVar4 = IntConstantBounds::LowerBound(&local_90);
          newMax = IntConstantBounds::UpperBound(&local_90);
          TypeSpecializeIntDst
                    (this,pIVar1,LdLen_A,pVVar9,src1Value_00,(Value *)0x0,BailOutOnIrregularLength,
                     iVar4,newMax,dstValueRef,(AddSubConstantInfo *)0x0);
          *forceInvariantHoistingRef = true;
          return true;
        }
      }
      bVar3 = IR::Instr::HasBailOutInfo(*instrRef);
      if (bVar3) {
        BVar5 = IR::Instr::GetBailOutKind(*instrRef);
        if (BVar5 != BailOutMarkTempObject) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x29f6,"(instr->GetBailOutKind() == IR::BailOutMarkTempObject)",
                             "instr->GetBailOutKind() == IR::BailOutMarkTempObject");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        baseOpnd._0_4_ = IR::operator|(BailOutOnIrregularLength,BailOutMarkTempObject);
        IR::Instr::SetBailOutKind(*instrRef,(BailOutKind)baseOpnd);
      }
      else {
        GenerateBailAtOperation(this,instrRef,BailOutOnIrregularLength);
      }
    }
    TypeSpecializeIntDst
              (this,*instrRef,LdLen_A,(Value *)0x0,(Value *)0x0,(Value *)0x0,(BailOutKind)baseOpnd,0
               ,0x7fffffff,dstValueRef,(AddSubConstantInfo *)0x0);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::TypeSpecializeLdLen(
    IR::Instr * *const instrRef,
    Value * *const src1ValueRef,
    Value * *const dstValueRef,
    bool *const forceInvariantHoistingRef)
{
    Assert(instrRef);
    IR::Instr *&instr = *instrRef;
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdLen_A);
    Assert(src1ValueRef);
    Value *&src1Value = *src1ValueRef;
    Assert(dstValueRef);
    Value *&dstValue = *dstValueRef;
    Assert(forceInvariantHoistingRef);
    bool &forceInvariantHoisting = *forceInvariantHoistingRef;

    if(!DoLdLenIntSpec(instr, instr->GetSrc1()->GetValueType()))
    {
        return false;
    }

    IR::BailOutKind bailOutKind = IR::BailOutOnIrregularLength;
    if(!IsLoopPrePass())
    {
        IR::RegOpnd *const baseOpnd = instr->GetSrc1()->AsRegOpnd();
        if(baseOpnd->IsArrayRegOpnd())
        {
            StackSym *const lengthSym = baseOpnd->AsArrayRegOpnd()->LengthSym();
            if(lengthSym)
            {
                CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Ld_I4;
                instr->ReplaceSrc1(IR::RegOpnd::New(lengthSym, lengthSym->GetType(), func));
                instr->ClearBailOutInfo();

                // Find the hoisted length value
                Value *const lengthValue = CurrentBlockData()->FindValue(lengthSym);
                Assert(lengthValue);
                src1Value = lengthValue;
                ValueInfo *const lengthValueInfo = lengthValue->GetValueInfo();
                IntConstantBounds lengthConstantBounds;
                AssertVerify(lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds));
                Assert(lengthConstantBounds.LowerBound() >= 0);

                if (lengthValueInfo->GetSymStore() == lengthSym)
                {
                    // When type specializing the dst below, we will end up inserting lengthSym.u32 as symstore for a var
                    // Clear the symstore here, so that we dont end up with problems with copyprop later on
                    lengthValueInfo->SetSymStore(nullptr);
                }

                // Int-specialize, and transfer the value to the dst
                TypeSpecializeIntDst(
                    instr,
                    Js::OpCode::LdLen_A,
                    src1Value,
                    src1Value,
                    nullptr,
                    bailOutKind,
                    lengthConstantBounds.LowerBound(),
                    lengthConstantBounds.UpperBound(),
                    &dstValue);

                // Try to force hoisting the Ld_I4 so that the length will have an invariant sym store that can be
                // copy-propped. Invariant hoisting does not automatically hoist Ld_I4.
                forceInvariantHoisting = true;
                return true;
            }
        }

        if (instr->HasBailOutInfo())
        {
            Assert(instr->GetBailOutKind() == IR::BailOutMarkTempObject);
            bailOutKind = IR::BailOutOnIrregularLength | IR::BailOutMarkTempObject;
            instr->SetBailOutKind(bailOutKind);
        }
        else
        {
            Assert(bailOutKind == IR::BailOutOnIrregularLength);
            GenerateBailAtOperation(&instr, bailOutKind);
        }
    }

    TypeSpecializeIntDst(
        instr,
        Js::OpCode::LdLen_A,
        nullptr,
        nullptr,
        nullptr,
        bailOutKind,
        0,
        INT32_MAX,
        &dstValue);
    return true;
}